

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O3

CURLcode Curl_rand_bytes(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  ulong uVar2;
  ulong uVar3;
  uint r;
  uint local_2c;
  
  if (num == 0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  do {
    uVar3 = 4;
    if (num < 4) {
      uVar3 = num;
    }
    CVar1 = Curl_ssl_random(data,(uchar *)&local_2c,4);
    uVar2 = uVar3;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    do {
      *rnd = (uchar)local_2c;
      rnd = rnd + 1;
      local_2c = local_2c >> 8;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    num = num - uVar3;
  } while (num != 0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rand_bytes(struct Curl_easy *data,
#ifdef DEBUGBUILD
                         bool env_override,
#endif
                         unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
#ifndef DEBUGBUILD
  const bool env_override = FALSE;
#endif

  DEBUGASSERT(num);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r, env_override);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}